

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O3

int __thiscall QFileDialogPrivate::init(QFileDialogPrivate *this,EVP_PKEY_CTX *ctx)

{
  QWidget *this_00;
  char cVar1;
  bool bVar2;
  QPlatformDialogHelper *pQVar3;
  long in_FS_OFFSET;
  QAnyStringView QVar4;
  QByteArray local_78;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 local_48 [32];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  if (*(long *)(ctx + 0x18) != 0) {
    this->useDefaultCaption = false;
    QString::operator=(&this->setWindowTitle,(QString *)(ctx + 8));
    QWidget::setWindowTitle(this_00,(QString *)(ctx + 8));
  }
  QFileDialog::setAcceptMode((QFileDialog *)this_00,AcceptOpen);
  pQVar3 = QDialogPrivate::platformHelper(&this->super_QDialogPrivate);
  (this->super_QDialogPrivate).nativeDialogInUse = pQVar3 != (QPlatformDialogHelper *)0x0;
  if (pQVar3 == (QPlatformDialogHelper *)0x0) {
    createWidgets(this);
  }
  QFileDialog::setFileMode((QFileDialog *)this_00,AnyFile);
  if (*(long *)(ctx + 0x50) != 0) {
    QFileDialog::setNameFilter((QFileDialog *)this_00,(QString *)(ctx + 0x40));
  }
  QFileDialog::setDirectoryUrl((QFileDialog *)this_00,(QUrl *)(ctx + 0x20));
  cVar1 = QUrl::isLocalFile();
  if (cVar1 == '\0') {
    QFileDialog::selectUrl((QFileDialog *)this_00,(QUrl *)(ctx + 0x20));
  }
  else {
    QFileDialog::selectFile((QFileDialog *)this_00,(QString *)(ctx + 0x28));
  }
  bVar2 = restoreFromSettings(this);
  if (!bVar2) {
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_48._0_8_ = (QArrayData *)0x0;
    local_48._8_8_ = L"QtProject";
    local_48._16_8_ = 9;
    local_78.d.size = 0;
    local_78.d.d = (Data *)0x0;
    local_78.d.ptr = (char *)0x0;
    QSettings::QSettings
              ((QSettings *)&local_58,UserScope,(QString *)local_48,(QString *)&local_78,
               (QObject *)0x0);
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)local_48._0_8_ != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_48._0_8_ = *(int *)local_48._0_8_ + -1;
      UNLOCK();
      if (*(int *)local_48._0_8_ == 0) {
        QArrayData::deallocate((QArrayData *)local_48._0_8_,2,0x10);
      }
    }
    QVar4.m_size = (size_t)&local_58;
    QVar4.field_0.m_data = local_48;
    QSettings::value(QVar4);
    ::QVariant::toByteArray();
    QFileDialog::restoreState((QFileDialog *)this_00,&local_78);
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
      }
    }
    ::QVariant::~QVariant((QVariant *)local_48);
    QSettings::~QSettings((QSettings *)&local_58);
  }
  local_48._0_8_ = (**(code **)(*(long *)this_00 + 0x70))(this_00);
  if ((local_48._0_8_ & 0x8000000080000000) == 0) {
    QWidget::resize(this_00,(QSize *)local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::init(const QFileDialogArgs &args)
{
    Q_Q(QFileDialog);
    if (!args.caption.isEmpty()) {
        useDefaultCaption = false;
        setWindowTitle = args.caption;
        q->setWindowTitle(args.caption);
    }

    q->setAcceptMode(QFileDialog::AcceptOpen);
    nativeDialogInUse = platformFileDialogHelper() != nullptr;
    if (!nativeDialogInUse)
        createWidgets();
    q->setFileMode(QFileDialog::AnyFile);
    if (!args.filter.isEmpty())
        q->setNameFilter(args.filter);
    q->setDirectoryUrl(args.directory);
    if (args.directory.isLocalFile())
        q->selectFile(args.selection);
    else
        q->selectUrl(args.directory);

#if QT_CONFIG(settings)
    // Try to restore from the FileDialog settings group; if it fails, fall back
    // to the pre-5.5 QByteArray serialized settings.
    if (!restoreFromSettings()) {
        const QSettings settings(QSettings::UserScope, u"QtProject"_s);
        q->restoreState(settings.value("Qt/filedialog").toByteArray());
    }
#endif

#if defined(Q_EMBEDDED_SMALLSCREEN)
    qFileDialogUi->lookInLabel->setVisible(false);
    qFileDialogUi->fileNameLabel->setVisible(false);
    qFileDialogUi->fileTypeLabel->setVisible(false);
    qFileDialogUi->sidebar->hide();
#endif

    const QSize sizeHint = q->sizeHint();
    if (sizeHint.isValid())
       q->resize(sizeHint);
}